

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

bool __thiscall QTreeViewPrivate::hasVisibleChildren(QTreeViewPrivate *this,QModelIndex *parent)

{
  QTreeView *this_00;
  QAbstractItemModel *pQVar1;
  Data *pDVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int row;
  
  this_00 = *(QTreeView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  pQVar1 = (parent->m).ptr;
  if (((pQVar1 == (QAbstractItemModel *)0x0) ||
      (cVar3 = (**(code **)(*(long *)pQVar1 + 0x138))(pQVar1,parent), -1 < cVar3)) &&
     (pQVar1 = (this->super_QAbstractItemViewPrivate).model,
     cVar3 = (**(code **)(*(long *)pQVar1 + 0x88))(pQVar1,parent), cVar3 != '\0')) {
    pDVar2 = (this->hiddenIndexes).q_hash.d;
    if (pDVar2 == (Data *)0x0) {
      return true;
    }
    if (pDVar2->size == 0) {
      return true;
    }
    cVar3 = (**(code **)(*(long *)&(this_00->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget + 0x2c0))(this_00,parent);
    if (cVar3 == '\0') {
      pQVar1 = (this->super_QAbstractItemViewPrivate).model;
      iVar5 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,parent);
      if (iVar5 < 1) {
        if (iVar5 == 0) {
          return true;
        }
      }
      else {
        row = 0;
        do {
          bVar4 = QTreeView::isRowHidden(this_00,row,parent);
          if (!bVar4) {
            return true;
          }
          row = row + 1;
        } while (iVar5 != row);
      }
    }
  }
  return false;
}

Assistant:

bool QTreeViewPrivate::hasVisibleChildren(const QModelIndex& parent) const
{
    Q_Q(const QTreeView);
    if (parent.flags() & Qt::ItemNeverHasChildren)
        return false;
    if (model->hasChildren(parent)) {
        if (hiddenIndexes.isEmpty())
            return true;
        if (q->isIndexHidden(parent))
            return false;
        int rowCount = model->rowCount(parent);
        for (int i = 0; i < rowCount; ++i) {
            if (!q->isRowHidden(i, parent))
                return true;
        }
        if (rowCount == 0)
            return true;
    }
    return false;
}